

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void mstltest(void)

{
  int __ptr [2];
  int iVar1;
  FILE *__stream;
  double *x;
  double **seasonal;
  double *remainder;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  size_t __nmemb;
  ulong uVar5;
  long lVar6;
  undefined1 local_9cb8 [8];
  double temp [5000];
  uint local_58 [2];
  int f [2];
  int local_40 [2];
  int iterate;
  int s_window;
  int Nseas;
  
  __stream = fopen("../data/taylor.txt","r");
  if (__stream != (FILE *)0x0) {
    feof(__stream);
    lVar6 = 0;
    uVar4 = 0;
    s_window = 0;
    do {
      lVar6 = lVar6 + 0x100000000;
      __isoc99_fscanf(__stream,"%lf \n",local_9cb8 + uVar4);
      iVar1 = feof(__stream);
      s_window = s_window + 1;
      uVar4 = uVar4 + 8;
    } while (iVar1 == 0);
    lVar3 = 0;
    printf("N %d \n");
    __nmemb = lVar6 >> 0x20;
    x = (double *)malloc(lVar6 >> 0x1d);
    memcpy(x,local_9cb8,uVar4 & 0x7fffffff8);
    iterate = 2;
    local_58[0] = 0x30;
    local_58[1] = 0x150;
    local_40[0] = 2;
    local_40[1] = 0xd;
    seasonal = (double **)calloc(2,8);
    f = (int  [2])calloc(__nmemb,8);
    remainder = (double *)calloc(__nmemb,8);
    do {
      pdVar2 = (double *)calloc(__nmemb,8);
      seasonal[lVar3] = pdVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    mstl(x,s_window,(int *)local_58,&iterate,local_40 + 1,(double *)0x0,local_40,seasonal,
         (double *)f,remainder);
    if (0 < iterate) {
      uVar4 = (ulong)(uint)s_window;
      lVar6 = 0;
      do {
        printf("\n Seasonal%d :\n",(ulong)(uint)f[lVar6 + -2]);
        uVar5 = 0;
        do {
          printf("%g ",seasonal[lVar6][uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
        puts("\n");
        lVar6 = lVar6 + 1;
      } while (lVar6 < iterate);
    }
    iVar1 = s_window;
    __ptr = f;
    mdisplay((double *)f,1,s_window);
    mdisplay(remainder,1,iVar1);
    printf("\n %g %g %g %g \n",*x,x[1],x[__nmemb - 2],x[__nmemb - 1]);
    free(seasonal);
    free((void *)__ptr);
    free(remainder);
    free(x);
    fclose(__stream);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void mstltest() {
	FILE *ifp;
	double temp[5000];
	double *x;
    ifp = fopen("../data/taylor.txt", "r");
	int N;
	int i,j;

	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}

	N = i;

	printf("N %d \n",N);

	x = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N;++i) {
		x[i] = temp[i];
	}
	int Nseas = 2;
	int f[2] = {48,336};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);

	printf("\n %g %g %g %g \n",x[0],x[1],x[N-2],x[N-1]);
	free(seasonal);
	free(trend);
	free(remainder);
	free(x);
	fclose(ifp);
}